

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::~BayesianProbitRegressor_Gaussian
          (BayesianProbitRegressor_Gaussian *this)

{
  BayesianProbitRegressor_Gaussian *this_local;
  
  ~BayesianProbitRegressor_Gaussian(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

BayesianProbitRegressor_Gaussian::~BayesianProbitRegressor_Gaussian() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}